

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

void ui_leave_init(game_event_type type,game_event_data *data,void *user)

{
  void *user_local;
  game_event_data *data_local;
  game_event_type type_local;
  
  reset_visuals(true);
  process_character_pref_files();
  Term_xtra(L'\n',L'\0');
  Term_redraw_all();
  event_remove_handler(EVENT_INITSTATUS,splashscreen_note,(void *)0x0);
  prt("Please wait...",L'\0',L'\0');
  Term_fresh();
  return;
}

Assistant:

static void ui_leave_init(game_event_type type, game_event_data *data,
						  void *user)
{
	/* Reset visuals, then load prefs, and react to changes */
	reset_visuals(true);
	process_character_pref_files();
	Term_xtra(TERM_XTRA_REACT, 0);
	(void) Term_redraw_all();

	/* Remove our splashscreen handlers */
	event_remove_handler(EVENT_INITSTATUS, splashscreen_note, NULL);

	/* Flash a message */
	prt("Please wait...", 0, 0);

	/* Flush the message */
	Term_fresh();
}